

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlIsID(xmlDocPtr doc,xmlNodePtr elem,xmlAttrPtr attr)

{
  int iVar1;
  xmlChar **local_c8;
  xmlChar *local_c0;
  xmlChar *fullattrname;
  xmlChar *fullelemname;
  xmlChar fattr [50];
  xmlChar local_68 [8];
  xmlChar felem [50];
  xmlAttributePtr attrDecl;
  xmlAttrPtr attr_local;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  
  if ((attr == (xmlAttrPtr)0x0) || (attr->name == (xmlChar *)0x0)) {
    doc_local._4_4_ = 0;
  }
  else if ((((attr->ns == (xmlNs *)0x0) || (attr->ns->prefix == (xmlChar *)0x0)) ||
           (iVar1 = strcmp((char *)attr->name,"id"), iVar1 != 0)) ||
          (iVar1 = strcmp((char *)attr->ns->prefix,"xml"), iVar1 != 0)) {
    if (doc == (xmlDocPtr)0x0) {
      doc_local._4_4_ = 0;
    }
    else if (((doc->intSubset == (_xmlDtd *)0x0) && (doc->extSubset == (_xmlDtd *)0x0)) &&
            (doc->type != XML_HTML_DOCUMENT_NODE)) {
      doc_local._4_4_ = 0;
    }
    else if (doc->type == XML_HTML_DOCUMENT_NODE) {
      iVar1 = xmlStrEqual("id",attr->name);
      if ((iVar1 == 0) &&
         ((iVar1 = xmlStrEqual("name",attr->name), iVar1 == 0 ||
          ((elem != (xmlNodePtr)0x0 && (iVar1 = xmlStrEqual(elem->name,"a"), iVar1 == 0)))))) {
        doc_local._4_4_ = 0;
      }
      else {
        doc_local._4_4_ = 1;
      }
    }
    else if (elem == (xmlNodePtr)0x0) {
      doc_local._4_4_ = 0;
    }
    else {
      stack0xffffffffffffffd0 = (xmlAttributePtr)0x0;
      if ((elem->ns == (xmlNs *)0x0) || (elem->ns->prefix == (xmlChar *)0x0)) {
        local_c0 = elem->name;
      }
      else {
        local_c0 = xmlBuildQName(elem->name,elem->ns->prefix,local_68,0x32);
      }
      if ((attr->ns == (xmlNs *)0x0) || (attr->ns->prefix == (xmlChar *)0x0)) {
        local_c8 = (xmlChar **)attr->name;
      }
      else {
        local_c8 = (xmlChar **)
                   xmlBuildQName(attr->name,attr->ns->prefix,(xmlChar *)&fullelemname,0x32);
      }
      if ((((local_c0 != (xmlChar *)0x0) && (local_c8 != (xmlChar **)0x0)) &&
          (register0x00000000 = xmlGetDtdAttrDesc(doc->intSubset,local_c0,(xmlChar *)local_c8),
          register0x00000000 == (xmlAttributePtr)0x0)) && (doc->extSubset != (_xmlDtd *)0x0)) {
        register0x00000000 = xmlGetDtdAttrDesc(doc->extSubset,local_c0,(xmlChar *)local_c8);
      }
      if ((local_c8 != &fullelemname) && (local_c8 != (xmlChar **)attr->name)) {
        (*xmlFree)(local_c8);
      }
      if ((local_c0 != local_68) && (local_c0 != elem->name)) {
        (*xmlFree)(local_c0);
      }
      if ((stack0xffffffffffffffd0 == (xmlAttributePtr)0x0) ||
         (stack0xffffffffffffffd0->atype != XML_ATTRIBUTE_ID)) {
        doc_local._4_4_ = 0;
      }
      else {
        doc_local._4_4_ = 1;
      }
    }
  }
  else {
    doc_local._4_4_ = 1;
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlIsID(xmlDocPtr doc, xmlNodePtr elem, xmlAttrPtr attr) {
    if ((attr == NULL) || (attr->name == NULL)) return(0);
    if ((attr->ns != NULL) && (attr->ns->prefix != NULL) &&
        (!strcmp((char *) attr->name, "id")) &&
        (!strcmp((char *) attr->ns->prefix, "xml")))
	return(1);
    if (doc == NULL) return(0);
    if ((doc->intSubset == NULL) && (doc->extSubset == NULL) &&
        (doc->type != XML_HTML_DOCUMENT_NODE)) {
	return(0);
    } else if (doc->type == XML_HTML_DOCUMENT_NODE) {
        if ((xmlStrEqual(BAD_CAST "id", attr->name)) ||
	    ((xmlStrEqual(BAD_CAST "name", attr->name)) &&
	    ((elem == NULL) || (xmlStrEqual(elem->name, BAD_CAST "a")))))
	    return(1);
	return(0);
    } else if (elem == NULL) {
	return(0);
    } else {
	xmlAttributePtr attrDecl = NULL;

	xmlChar felem[50], fattr[50];
	xmlChar *fullelemname, *fullattrname;

	fullelemname = (elem->ns != NULL && elem->ns->prefix != NULL) ?
	    xmlBuildQName(elem->name, elem->ns->prefix, felem, 50) :
	    (xmlChar *)elem->name;

	fullattrname = (attr->ns != NULL && attr->ns->prefix != NULL) ?
	    xmlBuildQName(attr->name, attr->ns->prefix, fattr, 50) :
	    (xmlChar *)attr->name;

	if (fullelemname != NULL && fullattrname != NULL) {
	    attrDecl = xmlGetDtdAttrDesc(doc->intSubset, fullelemname,
		                         fullattrname);
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdAttrDesc(doc->extSubset, fullelemname,
					     fullattrname);
	}

	if ((fullattrname != fattr) && (fullattrname != attr->name))
	    xmlFree(fullattrname);
	if ((fullelemname != felem) && (fullelemname != elem->name))
	    xmlFree(fullelemname);

        if ((attrDecl != NULL) && (attrDecl->atype == XML_ATTRIBUTE_ID))
	    return(1);
    }
    return(0);
}